

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_printer.hpp
# Opt level: O3

void boost::unit_test::utils::print_escaped_cdata(ostream *where_to,const_string *value)

{
  ulong uVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  if (print_escaped_cdata(std::ostream&,boost::unit_test::basic_cstring<char_const>)::cdata_end ==
      '\0') {
    print_escaped_cdata();
  }
  pvVar4 = value->m_begin;
  uVar5 = (long)print_escaped_cdata::cdata_end.m_end - (long)print_escaped_cdata::cdata_end.m_begin;
  if (uVar5 == 0) {
    uVar1 = (long)value->m_end - (long)pvVar4;
  }
  else {
    pvVar3 = value->m_end;
    uVar1 = (long)pvVar3 - (long)pvVar4;
    if ((uVar5 <= uVar1) && (pvVar4 != pvVar3 + -uVar5 + 1)) {
      pvVar2 = pvVar4;
      if (uVar5 == 0) {
LAB_0017f77e:
        lVar6 = (long)pvVar2 - (long)pvVar4;
        if (lVar6 != -1) {
          uVar5 = lVar6 + 2;
          pvVar2 = pvVar4 + lVar6 + 2;
          if (uVar1 < uVar5) {
            pvVar2 = pvVar3;
          }
          local_48 = local_38;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pvVar4,pvVar2);
          std::__ostream_insert<char,std::char_traits<char>>(where_to,(char *)local_48,local_40);
          if (local_48 != local_38) {
            operator_delete(local_48,local_38[0] + 1);
          }
          local_48 = local_38;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,print_escaped_cdata::cdata_end.m_begin,
                     print_escaped_cdata::cdata_end.m_end);
          std::__ostream_insert<char,std::char_traits<char>>(where_to,(char *)local_48,local_40);
          if (local_48 != local_38) {
            operator_delete(local_48,local_38[0] + 1);
          }
          local_48 = local_38;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"<![CDATA[","");
          std::__ostream_insert<char,std::char_traits<char>>(where_to,(char *)local_48,local_40);
          if (local_48 != local_38) {
            operator_delete(local_48,local_38[0] + 1);
          }
          pvVar3 = value->m_begin;
          uVar1 = (long)value->m_end - (long)pvVar3;
          pvVar4 = pvVar3 + uVar5;
          pvVar3 = pvVar3 + -1;
          if (uVar1 != 0xffffffffffffffff) {
            pvVar3 = value->m_end;
          }
          if (uVar1 < uVar5) {
            pvVar4 = "";
            pvVar3 = "";
          }
          local_48 = local_38;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pvVar4,pvVar3);
          std::__ostream_insert<char,std::char_traits<char>>(where_to,(char *)local_48,local_40);
          if (local_48 == local_38) {
            return;
          }
          goto LAB_0017f763;
        }
      }
      else {
        do {
          uVar7 = 0;
          while (pvVar2[uVar7] == print_escaped_cdata::cdata_end.m_begin[uVar7]) {
            uVar7 = uVar7 + 1;
            if (uVar5 == uVar7) goto LAB_0017f77e;
          }
          bVar8 = pvVar2 != pvVar3 + -uVar5;
          pvVar2 = pvVar2 + 1;
        } while (bVar8);
      }
    }
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pvVar4,pvVar4 + uVar1);
  std::__ostream_insert<char,std::char_traits<char>>(where_to,(char *)local_48,local_40);
  if (local_48 == local_38) {
    return;
  }
LAB_0017f763:
  operator_delete(local_48,local_38[0] + 1);
  return;
}

Assistant:

inline void
print_escaped_cdata( std::ostream& where_to, const_string value )
{
    static const_string cdata_end( "]]>" );

    const_string::size_type pos = value.find( cdata_end );
    if( pos == const_string::npos )
        where_to << value;
    else {
        where_to << value.substr( 0, pos+2 ) << cdata_end
                 << BOOST_TEST_L( "<![CDATA[" ) << value.substr( pos+2 );
    }
}